

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::SourceLineInfo::SourceLineInfo(SourceLineInfo *this,SourceLineInfo *other)

{
  pointer pcVar1;
  
  (this->file)._M_dataplus._M_p = (pointer)&(this->file).field_2;
  pcVar1 = (other->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (other->file)._M_string_length);
  this->line = other->line;
  return;
}

Assistant:

SourceLineInfo::SourceLineInfo( SourceLineInfo const& other )
    :   file( other.file ),
        line( other.line )
    {}